

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol_test.cpp
# Opt level: O1

string * CreatePacketV1(string *__return_storage_ptr__,string *user_data)

{
  Packet packet;
  undefined1 local_58 [24];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_58[0] = '\0';
  local_58._4_4_ = 0x3039;
  local_58._8_4_ = 0xd431;
  local_58._16_8_ = 0x499602d2;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_assign((string *)&local_40);
  udpdiscovery::Packet::Serialize((Packet *)local_58,kProtocolVersion1,__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CreatePacketV1(const std::string& user_data) {
  std::string result;

  udpdiscovery::Packet packet;
  packet.set_packet_type(udpdiscovery::kPacketIAmHere);
  packet.set_application_id(kApplicationId);
  packet.set_peer_id(kPeerId);
  packet.set_snapshot_index(kSnapshotIndex);
  packet.set_user_data(user_data);

  packet.Serialize(udpdiscovery::kProtocolVersion1, result);

  return result;
}